

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O1

bool tcu::isLevel1DLookupResultValid
               (ConstPixelBufferAccess *access,Sampler *sampler,TexLookupScaleMode scaleMode,
               IntLookupPrecision *prec,float coordX,int coordY,UVec4 *result)

{
  uint uVar1;
  uint uVar2;
  int ndx;
  int iVar3;
  int y;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  bool bVar8;
  int i;
  int c;
  float fVar9;
  Vector<bool,_4> res_3;
  Vector<bool,_4> res_2;
  Vector<bool,_4> res_1;
  Vector<unsigned_int,_4> res;
  Vector<unsigned_int,_4> color;
  Vec2 uBounds;
  byte local_64 [12];
  uint local_58 [4];
  tcu local_48 [16];
  float local_38;
  float local_34;
  
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&local_38,sampler->normalizedCoords,(access->m_size).m_data[0],
             coordX,(prec->coordBits).m_data[0],(prec->uvwBits).m_data[0]);
  fVar9 = floorf(local_38);
  c = (int)fVar9;
  fVar9 = floorf(local_34);
  iVar3 = (int)fVar9;
  bVar8 = c <= iVar3;
  if (c <= iVar3) {
    bVar8 = true;
    do {
      y = TexVerifierUtil::wrap(sampler->wrapS,c,(access->m_size).m_data[0]);
      if ((((y < 0) || ((access->m_size).m_data[0] <= y)) || (coordY < 0)) ||
         (((access->m_size).m_data[1] <= coordY || ((access->m_size).m_data[2] < 1)))) {
        sampleTextureBorder<unsigned_int>(local_48,&access->m_format,sampler);
      }
      else {
        ConstPixelBufferAccess::getPixelT<unsigned_int>
                  ((ConstPixelBufferAccess *)local_48,(int)access,y,coordY);
      }
      local_58[0] = 0;
      local_58[1] = 0;
      local_58[2] = 0;
      local_58[3] = 0;
      lVar4 = 0;
      do {
        uVar1 = result->m_data[lVar4];
        uVar2 = *(uint *)(local_48 + lVar4 * 4);
        uVar6 = uVar1 - uVar2;
        if (uVar1 < uVar2) {
          uVar6 = -(uVar1 - uVar2);
        }
        local_58[lVar4] = uVar6;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 4);
      local_64[8] = 0;
      local_64[9] = 0;
      local_64[10] = 0;
      local_64[0xb] = 0;
      lVar4 = 0;
      do {
        local_64[lVar4 + 8] = local_58[lVar4] <= (prec->colorThreshold).m_data[lVar4];
        lVar4 = lVar4 + 1;
      } while (lVar4 != 4);
      local_64[4] = 0;
      local_64[5] = 0;
      local_64[6] = 0;
      local_64[7] = 0;
      lVar4 = 0;
      do {
        local_64[lVar4 + 4] = (prec->colorMask).m_data[lVar4] ^ 1;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 4);
      local_64[0] = 0;
      local_64[1] = 0;
      local_64[2] = 0;
      local_64[3] = 0;
      lVar4 = 0;
      do {
        local_64[lVar4] = local_64[lVar4 + 4] | local_64[lVar4 + 8];
        lVar4 = lVar4 + 1;
      } while (lVar4 != 4);
      if (local_64[0] != 0) {
        uVar5 = 0xffffffffffffffff;
        do {
          if (uVar5 == 2) {
            uVar7 = 3;
            break;
          }
          uVar7 = uVar5 + 1;
          lVar4 = uVar5 + 2;
          uVar5 = uVar7;
        } while (local_64[lVar4] != 0);
        if (2 < uVar7) {
          return bVar8;
        }
      }
      c = c + 1;
      bVar8 = c <= iVar3;
    } while (c <= iVar3);
  }
  return bVar8;
}

Assistant:

bool isLevel1DLookupResultValid (const ConstPixelBufferAccess&	access,
								 const Sampler&					sampler,
								 TexLookupScaleMode				scaleMode,
								 const IntLookupPrecision&		prec,
								 const float					coordX,
								 const int						coordY,
								 const UVec4&					result)
{
	DE_ASSERT(sampler.minFilter == Sampler::NEAREST && sampler.magFilter == Sampler::NEAREST);
	DE_UNREF(scaleMode);
	return isNearestSampleResultValid(access, sampler, prec, coordX, coordY, result);
}